

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceDecomposition.cpp
# Opt level: O2

void __thiscall
OpenMD::ForceDecomposition::ForceDecomposition
          (ForceDecomposition *this,SimInfo *info,InteractionManager *iMan)

{
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *__s;
  vector<OpenMD::Vector3<int>,_std::allocator<OpenMD::Vector3<int>_>_> *this_00;
  SimInfo *pSVar1;
  SnapshotManager *pSVar2;
  Globals *pGVar3;
  pointer pVVar4;
  int iVar5;
  Vector<int,_3U> local_5c [3];
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *local_38;
  
  this->_vptr_ForceDecomposition = (_func_int **)&PTR__ForceDecomposition_002c3708;
  this->info_ = info;
  this->interactionMan_ = iMan;
  this->needVelocities_ = false;
  (this->idents).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->idents).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->idents).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->regions).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->regions).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->regions).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  Vector<double,_7U>::Vector(&this->pairwisePot);
  Vector<double,_7U>::Vector(&this->selfPot);
  Vector<double,_7U>::Vector(&this->excludedPot);
  Vector<double,_7U>::Vector(&this->excludedSelfPot);
  Vector<double,_7U>::Vector(&this->selectedPot);
  Vector<double,_7U>::Vector(&this->selectedSelfPot);
  __s = &this->toposForAtom;
  memset(__s,0,0xa8);
  Vector<int,_3U>::Vector(&(this->nCells_).super_Vector<int,_3U>);
  (this->cellList_).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->cellList_).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->cellList_).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pSVar1 = this->info_;
  pSVar2 = pSVar1->sman_;
  this->sman_ = pSVar2;
  iVar5 = pSVar2->rigidBodyStorageLayout_;
  this->atomStorageLayout_ = pSVar2->atomStorageLayout_;
  this->rigidBodyStorageLayout_ = iVar5;
  this->cutoffGroupStorageLayout_ = pSVar2->cutoffGroupStorageLayout_;
  this->ff_ = pSVar1->forceField_;
  this->usePeriodicBoundaryConditions_ =
       (bool)(info->simParams_->UsePeriodicBoundaryConditions).super_ParameterBase.field_0x2b;
  pGVar3 = pSVar1->simParams_;
  if (((pGVar3->PrintHeatFlux).super_ParameterBase.empty_ == false) &&
     ((pGVar3->PrintHeatFlux).super_ParameterBase.field_0x2b == '\x01')) {
    this->needVelocities_ = true;
  }
  this_00 = &this->cellOffsets_;
  local_38 = __s;
  if ((pGVar3->SkinThickness).super_ParameterBase.empty_ == false) {
    this->skinThickness_ = (pGVar3->SkinThickness).data_;
  }
  else {
    this->skinThickness_ = 1.0;
    snprintf(painCave.errMsg,2000,
             "ForceDecomposition: No value was set for the skinThickness.\n\tOpenMD will use a default value of %f Angstroms\n\tfor this simulation\n"
             ,0);
    painCave.isFatal = 0;
    painCave.severity = 3;
    simError();
  }
  pVVar4 = (this->cellOffsets_).
           super__Vector_base<OpenMD::Vector3<int>,_std::allocator<OpenMD::Vector3<int>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->cellOffsets_).
      super__Vector_base<OpenMD::Vector3<int>,_std::allocator<OpenMD::Vector3<int>_>_>._M_impl.
      super__Vector_impl_data._M_finish != pVVar4) {
    (this->cellOffsets_).
    super__Vector_base<OpenMD::Vector3<int>,_std::allocator<OpenMD::Vector3<int>_>_>._M_impl.
    super__Vector_impl_data._M_finish = pVVar4;
  }
  Vector<int,_3U>::Vector(local_5c);
  local_5c[0].data_[0] = 0;
  local_5c[0].data_[1] = 0;
  local_5c[0].data_[2] = 0;
  std::vector<OpenMD::Vector3<int>,std::allocator<OpenMD::Vector3<int>>>::
  emplace_back<OpenMD::Vector3<int>>
            ((vector<OpenMD::Vector3<int>,std::allocator<OpenMD::Vector3<int>>> *)this_00,
             (Vector3<int> *)local_5c);
  Vector<int,_3U>::Vector(local_5c);
  local_5c[0].data_[0] = 1;
  local_5c[0].data_[1] = 0;
  local_5c[0].data_[2] = 0;
  std::vector<OpenMD::Vector3<int>,std::allocator<OpenMD::Vector3<int>>>::
  emplace_back<OpenMD::Vector3<int>>
            ((vector<OpenMD::Vector3<int>,std::allocator<OpenMD::Vector3<int>>> *)this_00,
             (Vector3<int> *)local_5c);
  Vector<int,_3U>::Vector(local_5c);
  local_5c[0].data_[0] = 1;
  local_5c[0].data_[1] = 1;
  local_5c[0].data_[2] = 0;
  std::vector<OpenMD::Vector3<int>,std::allocator<OpenMD::Vector3<int>>>::
  emplace_back<OpenMD::Vector3<int>>
            ((vector<OpenMD::Vector3<int>,std::allocator<OpenMD::Vector3<int>>> *)this_00,
             (Vector3<int> *)local_5c);
  Vector<int,_3U>::Vector(local_5c);
  local_5c[0].data_[0] = 0;
  local_5c[0].data_[1] = 1;
  local_5c[0].data_[2] = 0;
  std::vector<OpenMD::Vector3<int>,std::allocator<OpenMD::Vector3<int>>>::
  emplace_back<OpenMD::Vector3<int>>
            ((vector<OpenMD::Vector3<int>,std::allocator<OpenMD::Vector3<int>>> *)this_00,
             (Vector3<int> *)local_5c);
  Vector<int,_3U>::Vector(local_5c);
  local_5c[0].data_[0] = -1;
  local_5c[0].data_[1] = 1;
  local_5c[0].data_[2] = 0;
  std::vector<OpenMD::Vector3<int>,std::allocator<OpenMD::Vector3<int>>>::
  emplace_back<OpenMD::Vector3<int>>
            ((vector<OpenMD::Vector3<int>,std::allocator<OpenMD::Vector3<int>>> *)this_00,
             (Vector3<int> *)local_5c);
  Vector<int,_3U>::Vector(local_5c);
  local_5c[0].data_[0] = 0;
  local_5c[0].data_[1] = 0;
  local_5c[0].data_[2] = 1;
  std::vector<OpenMD::Vector3<int>,std::allocator<OpenMD::Vector3<int>>>::
  emplace_back<OpenMD::Vector3<int>>
            ((vector<OpenMD::Vector3<int>,std::allocator<OpenMD::Vector3<int>>> *)this_00,
             (Vector3<int> *)local_5c);
  Vector<int,_3U>::Vector(local_5c);
  local_5c[0].data_[0] = 1;
  local_5c[0].data_[1] = 0;
  local_5c[0].data_[2] = 1;
  std::vector<OpenMD::Vector3<int>,std::allocator<OpenMD::Vector3<int>>>::
  emplace_back<OpenMD::Vector3<int>>
            ((vector<OpenMD::Vector3<int>,std::allocator<OpenMD::Vector3<int>>> *)this_00,
             (Vector3<int> *)local_5c);
  Vector<int,_3U>::Vector(local_5c);
  local_5c[0].data_[0] = 1;
  local_5c[0].data_[1] = 1;
  local_5c[0].data_[2] = 1;
  std::vector<OpenMD::Vector3<int>,std::allocator<OpenMD::Vector3<int>>>::
  emplace_back<OpenMD::Vector3<int>>
            ((vector<OpenMD::Vector3<int>,std::allocator<OpenMD::Vector3<int>>> *)this_00,
             (Vector3<int> *)local_5c);
  Vector<int,_3U>::Vector(local_5c);
  local_5c[0].data_[0] = 0;
  local_5c[0].data_[1] = 1;
  local_5c[0].data_[2] = 1;
  std::vector<OpenMD::Vector3<int>,std::allocator<OpenMD::Vector3<int>>>::
  emplace_back<OpenMD::Vector3<int>>
            ((vector<OpenMD::Vector3<int>,std::allocator<OpenMD::Vector3<int>>> *)this_00,
             (Vector3<int> *)local_5c);
  Vector<int,_3U>::Vector(local_5c);
  local_5c[0].data_[0] = -1;
  local_5c[0].data_[1] = 1;
  local_5c[0].data_[2] = 1;
  std::vector<OpenMD::Vector3<int>,std::allocator<OpenMD::Vector3<int>>>::
  emplace_back<OpenMD::Vector3<int>>
            ((vector<OpenMD::Vector3<int>,std::allocator<OpenMD::Vector3<int>>> *)this_00,
             (Vector3<int> *)local_5c);
  Vector<int,_3U>::Vector(local_5c);
  local_5c[0].data_[0] = -1;
  local_5c[0].data_[1] = 0;
  local_5c[0].data_[2] = 1;
  std::vector<OpenMD::Vector3<int>,std::allocator<OpenMD::Vector3<int>>>::
  emplace_back<OpenMD::Vector3<int>>
            ((vector<OpenMD::Vector3<int>,std::allocator<OpenMD::Vector3<int>>> *)this_00,
             (Vector3<int> *)local_5c);
  Vector<int,_3U>::Vector(local_5c);
  local_5c[0].data_[0] = -1;
  local_5c[0].data_[1] = -1;
  local_5c[0].data_[2] = 1;
  std::vector<OpenMD::Vector3<int>,std::allocator<OpenMD::Vector3<int>>>::
  emplace_back<OpenMD::Vector3<int>>
            ((vector<OpenMD::Vector3<int>,std::allocator<OpenMD::Vector3<int>>> *)this_00,
             (Vector3<int> *)local_5c);
  Vector<int,_3U>::Vector(local_5c);
  local_5c[0].data_[0] = 0;
  local_5c[0].data_[1] = -1;
  local_5c[0].data_[2] = 1;
  std::vector<OpenMD::Vector3<int>,std::allocator<OpenMD::Vector3<int>>>::
  emplace_back<OpenMD::Vector3<int>>
            ((vector<OpenMD::Vector3<int>,std::allocator<OpenMD::Vector3<int>>> *)this_00,
             (Vector3<int> *)local_5c);
  Vector<int,_3U>::Vector(local_5c);
  local_5c[0].data_[0] = 1;
  local_5c[0].data_[1] = -1;
  local_5c[0].data_[2] = 1;
  std::vector<OpenMD::Vector3<int>,std::allocator<OpenMD::Vector3<int>>>::
  emplace_back<OpenMD::Vector3<int>>
            ((vector<OpenMD::Vector3<int>,std::allocator<OpenMD::Vector3<int>>> *)this_00,
             (Vector3<int> *)local_5c);
  return;
}

Assistant:

ForceDecomposition::ForceDecomposition(SimInfo* info,
                                         InteractionManager* iMan) :
      info_(info),
      interactionMan_(iMan), needVelocities_(false) {
    sman_                     = info_->getSnapshotManager();
    atomStorageLayout_        = sman_->getAtomStorageLayout();
    rigidBodyStorageLayout_   = sman_->getRigidBodyStorageLayout();
    cutoffGroupStorageLayout_ = sman_->getCutoffGroupStorageLayout();
    ff_                       = info_->getForceField();

    usePeriodicBoundaryConditions_ =
        info->getSimParams()->getUsePeriodicBoundaryConditions();

    Globals* simParams_ = info_->getSimParams();
    if (simParams_->havePrintHeatFlux()) {
      if (simParams_->getPrintHeatFlux()) { needVelocities_ = true; }
    }

    if (simParams_->haveSkinThickness()) {
      skinThickness_ = simParams_->getSkinThickness();
    } else {
      skinThickness_ = 1.0;
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "ForceDecomposition: No value was set for the skinThickness.\n"
               "\tOpenMD will use a default value of %f Angstroms\n"
               "\tfor this simulation\n",
               skinThickness_);
      painCave.severity = OPENMD_INFO;
      painCave.isFatal  = 0;
      simError();
    }

    // cellOffsets are the partial space for the cell lists used in
    // constructing the neighbor lists
    cellOffsets_.clear();
    cellOffsets_.push_back(Vector3i(0, 0, 0));
    cellOffsets_.push_back(Vector3i(1, 0, 0));
    cellOffsets_.push_back(Vector3i(1, 1, 0));
    cellOffsets_.push_back(Vector3i(0, 1, 0));
    cellOffsets_.push_back(Vector3i(-1, 1, 0));
    cellOffsets_.push_back(Vector3i(0, 0, 1));
    cellOffsets_.push_back(Vector3i(1, 0, 1));
    cellOffsets_.push_back(Vector3i(1, 1, 1));
    cellOffsets_.push_back(Vector3i(0, 1, 1));
    cellOffsets_.push_back(Vector3i(-1, 1, 1));
    cellOffsets_.push_back(Vector3i(-1, 0, 1));
    cellOffsets_.push_back(Vector3i(-1, -1, 1));
    cellOffsets_.push_back(Vector3i(0, -1, 1));
    cellOffsets_.push_back(Vector3i(1, -1, 1));
  }